

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O1

dgEdge * __thiscall dgPolyhedra::AddFace(dgPolyhedra *this,HaI32 count,HaI32 *index,HaI64 *userdata)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  dgTreeNode *pdVar4;
  dgTreeNode *pdVar5;
  int iVar6;
  dgEdge *pdVar7;
  ulong uVar8;
  HaU64 HVar9;
  ulong uVar10;
  dgPairKey key;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  dgEdge *pdVar15;
  bool bVar16;
  bool bVar17;
  bool state;
  dgEdge tmpEdge_1;
  dgEdge tmpEdge;
  bool local_40c9;
  HaI32 *local_40c8;
  ulong local_40c0;
  dgPolyhedra *local_40b8;
  HaI64 *local_40b0;
  dgEdge *local_40a8;
  dgTreeNode *local_40a0;
  dgEdge local_4098;
  dgEdge local_4068;
  uint local_4038;
  ulong local_4030 [2048];
  
  local_40c0 = (ulong)(count + -1);
  if (count < 1) {
    local_4038 = 0;
  }
  else {
    iVar6 = index[local_40c0];
    pdVar5 = (this->super_dgTree<dgEdge,_long>).m_head;
    uVar10 = 0;
    local_4038 = 0;
    do {
      iVar2 = index[uVar10];
      uVar11 = (long)iVar6 << 0x20 | (long)iVar2;
      bVar16 = (int)local_4038 < 1;
      if ((int)local_4038 < 1) {
        uVar8 = 0;
LAB_0087b1a4:
        local_4030[uVar8] = uVar11;
        local_4038 = local_4038 + 1;
      }
      else if (local_4030[0] == uVar11) {
        bVar16 = false;
      }
      else {
        uVar8 = (ulong)local_4038;
        uVar12 = 0;
        do {
          if (uVar8 - 1 == uVar12) {
            bVar16 = true;
            goto LAB_0087b1a4;
          }
          uVar14 = uVar12 + 1;
          lVar13 = uVar12 + 1;
          uVar12 = uVar14;
        } while (local_4030[lVar13] != uVar11);
        bVar16 = uVar8 <= uVar14;
      }
      if (bVar16) {
        uVar8 = (long)iVar2 << 0x20 | (long)iVar6;
        bVar17 = (int)local_4038 < 1;
        if ((int)local_4038 < 1) {
          uVar12 = 0;
LAB_0087b215:
          local_4030[uVar12] = uVar8;
          local_4038 = local_4038 + 1;
        }
        else if (local_4030[0] == uVar8) {
          bVar17 = false;
        }
        else {
          uVar12 = (ulong)local_4038;
          uVar14 = 0;
          do {
            if (uVar12 - 1 == uVar14) {
              bVar17 = true;
              goto LAB_0087b215;
            }
            uVar1 = uVar14 + 1;
            lVar13 = uVar14 + 1;
            uVar14 = uVar1;
          } while (local_4030[lVar13] != uVar8);
          bVar17 = uVar12 <= uVar1;
        }
        bVar16 = false;
        if ((bVar17) && (bVar16 = false, iVar6 != iVar2)) {
          bVar16 = true;
          for (pdVar4 = pdVar5; pdVar4 != (dgTreeNode *)0x0;
              pdVar4 = *(dgTreeNode **)
                        ((long)&(pdVar4->super_dgRedBackNode)._vptr_dgRedBackNode + lVar13)) {
            lVar13 = 8;
            if ((pdVar4->m_key <= (long)uVar11) && (lVar13 = 0x10, (long)uVar11 <= pdVar4->m_key)) {
              bVar16 = false;
              break;
            }
          }
          if (bVar16) {
            iVar6 = iVar2;
          }
        }
      }
      else {
        bVar16 = false;
      }
      if (!bVar16) {
        return (dgEdge *)0x0;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)count);
  }
  local_4068.m_incidentFace = this->m_faceSecuence + 1;
  this->m_faceSecuence = local_4068.m_incidentFace;
  local_4068.m_incidentVertex = index[local_40c0];
  uVar3 = *index;
  if (userdata == (HaI64 *)0x0) {
    local_4068.m_userData = 0;
    HVar9 = 0;
  }
  else {
    local_4068.m_userData = userdata[local_40c0];
    HVar9 = *userdata;
  }
  local_4068.m_next = (dgEdge *)0x0;
  local_4068.m_prev._0_4_ = 0;
  local_4068.m_prev._4_4_ = 0;
  local_4068.m_twin._0_4_ = 0;
  local_4068._36_8_ = 0;
  local_40c8 = index;
  local_40b8 = this;
  local_40b0 = userdata;
  local_40a0 = dgTree<dgEdge,_long>::Insert
                         (&this->super_dgTree<dgEdge,_long>,&local_4068,
                          (long)local_4068.m_incidentVertex << 0x20 | (long)(int)uVar3,&local_40c9);
  if (local_40c9 == true) {
    __assert_fail("!state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                  ,0x773,
                  "dgEdge *dgPolyhedra::AddFace(hacd::HaI32, const hacd::HaI32 *const, const hacd::HaI64 *const)"
                 );
  }
  pdVar7 = &local_40a0->m_info;
  local_40a8 = pdVar7;
  if (1 < count) {
    local_40c0 = (ulong)(uint)count;
    uVar10 = 1;
    local_4098.m_userData = HVar9;
    pdVar15 = pdVar7;
    local_4098.m_incidentVertex = uVar3;
    do {
      if (local_40b0 == (HaI64 *)0x0) {
        HVar9 = 0;
      }
      else {
        HVar9 = local_40b0[uVar10];
      }
      uVar3 = local_40c8[uVar10];
      local_4098.m_incidentFace = local_40b8->m_faceSecuence;
      local_4098.m_twin._0_4_ = 0;
      local_4098._36_8_ = 0;
      local_4098.m_next = (dgEdge *)0x0;
      local_4098.m_prev._0_4_ = 0;
      local_4098.m_prev._4_4_ = 0;
      pdVar5 = dgTree<dgEdge,_long>::Insert
                         (&local_40b8->super_dgTree<dgEdge,_long>,&local_4098,
                          (ulong)(uint)local_4098.m_incidentVertex << 0x20 | (long)(int)uVar3,
                          &local_40c9);
      if (local_40c9 == true) {
        __assert_fail("!state",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                      ,0x780,
                      "dgEdge *dgPolyhedra::AddFace(hacd::HaI32, const hacd::HaI32 *const, const hacd::HaI64 *const)"
                     );
      }
      pdVar7 = &pdVar5->m_info;
      pdVar15->m_next = pdVar7;
      (pdVar5->m_info).m_prev = pdVar15;
      uVar10 = uVar10 + 1;
      local_4098.m_userData = HVar9;
      pdVar15 = pdVar7;
      local_4098.m_incidentVertex = uVar3;
    } while (local_40c0 != uVar10);
  }
  (local_40a0->m_info).m_prev = pdVar7;
  pdVar7->m_next = local_40a8;
  return (local_40a0->m_info).m_next;
}

Assistant:

dgEdge* dgPolyhedra::AddFace ( hacd::HaI32 count, const hacd::HaI32* const index, const hacd::HaI64* const userdata)
{
	class IntersectionFilter
	{
		public:
		IntersectionFilter ()
		{
			m_count = 0;
		}

		bool Insert (hacd::HaI32 dummy, hacd::HaI64 value)
		{
			hacd::HaI32 i;				
			for (i = 0 ; i < m_count; i ++) {
				if (m_array[i] == value) {
					return false;
				}
			}
			m_array[i] = value;
			m_count ++;
			return true;
		}

		hacd::HaI32 m_count;
		hacd::HaI64 m_array[2048];
	};

	IntersectionFilter selfIntersectingFaceFilter;

	hacd::HaI32 dummyValues = 0;
	hacd::HaI32 i0 = index[count-1];
	for (hacd::HaI32 i = 0; i < count; i ++) {
		hacd::HaI32 i1 = index[i];
		dgPairKey code0 (i0, i1);

		if (!selfIntersectingFaceFilter.Insert (dummyValues, code0.GetVal())) {
			return NULL;
		}

		dgPairKey code1 (i1, i0);
		if (!selfIntersectingFaceFilter.Insert (dummyValues, code1.GetVal())) {
			return NULL;
		}


		if (i0 == i1) {
			return NULL;
		}
		if (FindEdge (i0, i1)) {
			return NULL;
		}
		i0 = i1;
	}

	m_faceSecuence ++;

	i0 = index[count-1];
	hacd::HaI32 i1 = index[0];
	hacd::HaU64 udata0 = 0;
	hacd::HaU64 udata1 = 0;
	if (userdata) {
		udata0 = hacd::HaU64 (userdata[count-1]);
		udata1 = hacd::HaU64 (userdata[0]);
	} 

	bool state;
	dgPairKey code (i0, i1);
	dgEdge tmpEdge (i0, m_faceSecuence, udata0);
	dgTreeNode* node = Insert (tmpEdge, code.GetVal(), state); 
	HACD_ASSERT (!state);
	dgEdge* edge0 = &node->GetInfo();
	dgEdge* const first = edge0;

	for (hacd::HaI32 i = 1; i < count; i ++) {
		i0 = i1;
		i1 = index[i];
		udata0 = udata1;
		udata1 = hacd::HaU64 (userdata ? userdata[i] : 0);

		dgPairKey code (i0, i1);
		dgEdge tmpEdge (i0, m_faceSecuence, udata0);
		node = Insert (tmpEdge, code.GetVal(), state); 
		HACD_ASSERT (!state);

		dgEdge* const edge1 = &node->GetInfo();
		edge0->m_next = edge1;
		edge1->m_prev = edge0;
		edge0 = edge1;
	}

	first->m_prev = edge0;
	edge0->m_next = first;

	return first->m_next;
}